

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall anon_unknown.dwarf_8937a7::InfoWriter::Save(InfoWriter *this,string *filename)

{
  undefined1 extraout_AL;
  size_t __n;
  allocator<char> local_311;
  String local_310;
  StyledStreamWriter jsonWriter;
  cmGeneratedFileStream fileStream;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&fileStream,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fileStream,true);
  __n = 1;
  cmGeneratedFileStream::Open(&fileStream,filename,false,true);
  if (((&fileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"\t",&local_311);
    Json::StyledStreamWriter::StyledStreamWriter(&jsonWriter,&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    Json::StyledStreamWriter::write(&jsonWriter,(int)&fileStream,this,__n);
    cmGeneratedFileStream::Close(&fileStream);
    Json::StyledStreamWriter::~StyledStreamWriter(&jsonWriter);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fileStream);
  return (bool)extraout_AL;
}

Assistant:

bool InfoWriter::Save(std::string const& filename)
{
  cmGeneratedFileStream fileStream;
  fileStream.SetCopyIfDifferent(true);
  fileStream.Open(filename, false, true);
  if (!fileStream) {
    return false;
  }

  Json::StyledStreamWriter jsonWriter;
  try {
    jsonWriter.write(fileStream, this->Value_);
  } catch (...) {
    return false;
  }

  return fileStream.Close();
}